

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_array_suite.cpp
# Opt level: O3

void api_suite::api_insert_hint(void)

{
  ulong ****ppppuVar1;
  ulong ***pppuVar2;
  map_array<int,_int,_4UL,_std::less<int>_> array;
  ulong ***local_68;
  ulong ***local_60;
  ulong **local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  ulong ***local_38;
  ulong ***local_30;
  ulong ***local_28;
  
  local_30 = (ulong ***)&local_38;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = (ulong **)0x0;
  uStack_50 = 0;
  local_38 = &local_58;
  local_60 = (ulong ***)0x0;
  local_68 = (ulong ***)((ulong)local_68 & 0xffffffff00000000);
  local_28 = local_38;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("array.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x59,"void api_suite::api_insert_hint()",&local_60,&local_68);
  local_60 = local_28;
  if (local_28 != local_30) {
    ppppuVar1 = (ulong ****)(local_28 + 1);
    *local_28 = (ulong **)0x10000000b;
    local_28 = (ulong ***)ppppuVar1;
    local_60 = local_28;
    if ((local_38 != local_28) && (local_60 = local_28 + -1, local_60 != local_38)) {
      pppuVar2 = (ulong ***)(ulong)*(uint *)local_60;
      ppppuVar1 = (ulong ****)local_60;
      do {
        local_60 = (ulong ***)ppppuVar1;
        if ((int)*(uint *)(ppppuVar1 + -1) <= (int)pppuVar2) break;
        local_60 = (ulong ***)(ppppuVar1 + -1);
        pppuVar2 = *ppppuVar1;
        *ppppuVar1 = ppppuVar1[-1];
        ppppuVar1[-1] = pppuVar2;
        ppppuVar1 = (ulong ****)local_60;
      } while (local_60 != local_38);
    }
  }
  local_68 = local_38;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,vista::pair<int,int>*,vista::pair<int,int>*>
            ("array.insert(array.begin(), { 11, 1 })","array.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x5a,"void api_suite::api_insert_hint()",&local_60,&local_68);
  local_60 = (ulong ***)((long)local_28 - (long)local_38 >> 3);
  local_68 = (ulong ***)CONCAT44(local_68._4_4_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("array.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x5b,"void api_suite::api_insert_hint()",&local_60,&local_68);
  return;
}

Assistant:

void api_ctor_default()
{
    map_array<int, int, 4> array;
    BOOST_TEST_EQ(array.size(), 0);
    BOOST_TEST_EQ(array.capacity(), 4);
}